

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

vector<DataSet,_std::allocator<DataSet>_> * __thiscall
DataSet::split(vector<DataSet,_std::allocator<DataSet>_> *__return_storage_ptr__,DataSet *this,
              initializer_list<double> percentages)

{
  uint uVar1;
  const_iterator pdVar2;
  double *pdVar3;
  bool bVar4;
  Shape SVar5;
  uint local_194;
  DataSet local_188;
  undefined8 local_f0;
  undefined1 local_e8;
  undefined8 local_dc;
  undefined1 local_d4;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined8 local_bc;
  undefined1 local_b4;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined8 local_9c;
  undefined1 local_94;
  undefined8 local_90;
  undefined1 local_88;
  undefined8 local_7c;
  undefined1 local_74;
  ulong local_70;
  undefined1 local_68;
  ulong local_50;
  undefined1 local_48;
  uint local_44;
  const_iterator pdStack_40;
  uint i;
  const_iterator percentage;
  uint size;
  uint end;
  uint beg;
  DataSet *this_local;
  initializer_list<double> percentages_local;
  vector<DataSet,_std::allocator<DataSet>_> *datasets;
  
  percentages_local._M_array = (iterator)percentages._M_len;
  this_local = (DataSet *)percentages._M_array;
  end._3_1_ = 0;
  _beg = this;
  percentages_local._M_len = (size_type)__return_storage_ptr__;
  std::vector<DataSet,_std::allocator<DataSet>_>::vector(__return_storage_ptr__);
  percentage._0_4_ = 0;
  pdStack_40 = std::initializer_list<double>::begin((initializer_list<double> *)&this_local);
  local_44 = 0;
  while( true ) {
    pdVar3 = pdStack_40;
    pdVar2 = std::initializer_list<double>::end((initializer_list<double> *)&this_local);
    if (pdVar2 <= pdVar3) {
      return __return_storage_ptr__;
    }
    SVar5 = Matrix<double>::shape(&this->m_matrix);
    local_70 = SVar5._0_8_;
    local_68 = SVar5.is_diogonal;
    percentage._0_4_ = (int)(long)(((double)(local_70 & 0xffffffff) * *pdStack_40) / 100.0);
    size = local_44;
    uVar1 = local_44 + (int)percentage;
    local_50 = local_70;
    local_48 = local_68;
    percentage._4_4_ = uVar1;
    SVar5 = Matrix<double>::shape(&this->m_matrix);
    local_90 = SVar5._0_8_;
    local_88 = SVar5.is_diogonal;
    local_7c._0_4_ = SVar5.n_row;
    bVar4 = (uint)local_7c < uVar1;
    local_7c = local_90;
    local_74 = local_88;
    if (bVar4) {
      SVar5 = Matrix<double>::shape(&this->m_matrix);
      local_b0 = SVar5._0_8_;
      local_a8 = SVar5.is_diogonal;
      local_9c._0_4_ = SVar5.n_row;
      percentage._4_4_ = (uint)local_9c;
      local_9c = local_b0;
      local_94 = local_a8;
    }
    pdVar3 = pdStack_40 + 1;
    pdVar2 = std::initializer_list<double>::end((initializer_list<double> *)&this_local);
    uVar1 = percentage._4_4_;
    bVar4 = false;
    if (pdVar3 == pdVar2) {
      SVar5 = Matrix<double>::shape(&this->m_matrix);
      local_d0 = SVar5._0_8_;
      local_c8 = SVar5.is_diogonal;
      local_bc._0_4_ = SVar5.n_row;
      bVar4 = uVar1 != (uint)local_bc;
      local_bc = local_d0;
      local_b4 = local_c8;
    }
    if (bVar4) {
      SVar5 = Matrix<double>::shape(&this->m_matrix);
      local_f0 = SVar5._0_8_;
      local_e8 = SVar5.is_diogonal;
      local_dc._0_4_ = SVar5.n_row;
      percentage._4_4_ = (uint)local_dc;
      local_dc = local_f0;
      local_d4 = local_e8;
    }
    local_44 = percentage._4_4_;
    DataSet(&local_188,&this->m_matrix,size,percentage._4_4_,&this->m_labels);
    std::vector<DataSet,_std::allocator<DataSet>_>::push_back(__return_storage_ptr__,&local_188);
    ~DataSet(&local_188);
    uVar1 = percentage._4_4_;
    SVar5 = Matrix<double>::shape(&this->m_matrix);
    local_194 = SVar5.n_row;
    if (uVar1 == local_194) break;
    pdStack_40 = pdStack_40 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DataSet> DataSet::split(const std::initializer_list<double> percentages){
    std::vector<DataSet> datasets;
    unsigned beg, end, size=0;
    auto percentage=percentages.begin();

    for(unsigned i=0;percentage<percentages.end();++percentage){
        size=m_matrix.shape().n_row*(*percentage)/100.;
        beg=i;
        end=beg+size;
        if(end>m_matrix.shape().n_row) end=m_matrix.shape().n_row;
        if(percentage+1==percentages.end() && end!=m_matrix.shape().n_row)
            end=m_matrix.shape().n_row;
        i=end;
        datasets.push_back(DataSet(m_matrix, beg, end, m_labels));

        if(end==m_matrix.shape().n_row) break;
    }

    return datasets;
}